

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O3

CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
          (CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *other)

{
  CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *pCVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  
  uVar9 = *(ulong *)(this + 0x10);
  if (uVar9 == 3) {
    lVar4 = *(long *)(this + 0x18);
    pCVar1 = this + 8;
    lVar3 = *(long *)pCVar1;
    *(long *)pCVar1 = *(long *)pCVar1 + lVar4;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 3;
    if (*(long *)pCVar1 != 0 && SCARRY8(lVar3,lVar4) == *(long *)pCVar1 < 0) {
      __assert_fail("m_row+m_currentBlockRows<=m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x5d,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, 3, 1>, const Eigen::Matrix<double, 3, 1>>]"
                   );
    }
    uVar9 = 0;
  }
  else if (2 < (long)uVar9) {
    __assert_fail("(m_col + other.cols() <= m_xpr.cols()) && \"Too many coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x60,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, 3, 1>, const Eigen::Matrix<double, 3, 1>>]"
                 );
  }
  if (*(long *)(this + 0x18) == 3) {
    if (((-1 < *(long *)(this + 8)) && (uVar9 < 3)) && (*(long *)(this + 8) == 0)) {
      lVar3 = *(long *)this;
      pdVar5 = *(double **)other;
      pdVar6 = *(double **)(other + 8);
      dVar7 = pdVar5[1];
      dVar8 = pdVar6[1];
      pdVar2 = (double *)(lVar3 + uVar9 * 0x18);
      *pdVar2 = *pdVar6 + *pdVar5;
      pdVar2[1] = dVar8 + dVar7;
      *(double *)(lVar3 + 0x10 + uVar9 * 0x18) = pdVar5[2] + pdVar6[2];
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      return (CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this;
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                  ,0x93,
                  "Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, 3, 3>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                 );
  }
  __assert_fail("m_currentBlockRows==other.rows()",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x61,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, 3, 1>, const Eigen::Matrix<double, 3, 1>>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const DenseBase<OtherDerived>& other)
  {
    if (m_col==m_xpr.cols() && (other.cols()!=0 || other.rows()!=m_currentBlockRows))
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = other.rows();
      eigen_assert(m_row+m_currentBlockRows<=m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert((m_col + other.cols() <= m_xpr.cols())
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==other.rows());
    m_xpr.template block<OtherDerived::RowsAtCompileTime, OtherDerived::ColsAtCompileTime>
                    (m_row, m_col, other.rows(), other.cols()) = other;
    m_col += other.cols();
    return *this;
  }